

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  PrimRefMB *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
  *pCVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  unsigned_long uVar17;
  size_t *psVar18;
  int iVar19;
  long lVar20;
  undefined4 uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  float fVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar59 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  undefined1 auVar62 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_208;
  unsigned_long local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  undefined1 local_1b8 [16];
  ulong local_170;
  anon_class_16_2_07cfa4d6 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar22 = r->_begin;
  uVar17 = r->_end;
  if (uVar22 < uVar17) {
    local_1b8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar51 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar36._8_4_ = 0xff800000;
    auVar36._0_8_ = 0xff800000ff800000;
    auVar36._12_4_ = 0xff800000;
    auVar55 = ZEXT1664(auVar36);
    auVar32._8_4_ = 0x7f800000;
    auVar32._0_8_ = 0x7f8000007f800000;
    auVar32._12_4_ = 0x7f800000;
    auVar56 = ZEXT1664(auVar32);
    local_1e0 = 0;
    auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar66 = ZEXT1664(auVar32);
    auVar64 = ZEXT1664(auVar36);
    auVar59 = ZEXT1664(auVar32);
    local_1d8 = 0;
    local_208 = 0;
    auVar62 = ZEXT1664(auVar36);
    local_1d0 = k;
    do {
      auVar43 = auVar45._0_16_;
      BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar27._8_8_ = 0;
      auVar27._0_4_ = BVar2.lower;
      auVar27._4_4_ = BVar2.upper;
      auVar36 = vmovshdup_avx(auVar27);
      fVar25 = BVar2.lower;
      fVar26 = auVar36._0_4_ - fVar25;
      uVar12 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar22);
      pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar12 + 3) < (pBVar3->super_RawBufferView).num) {
        fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar36 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar25) / fVar26) * 1.0000002));
        auVar36 = vroundss_avx(auVar36,auVar36,9);
        auVar36 = vmaxss_avx(auVar43,auVar36);
        auVar32 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar25) / fVar26) * 0.99999976));
        auVar32 = vroundss_avx(auVar32,auVar32,10);
        auVar32 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
        if ((uint)(int)auVar36._0_4_ <= (uint)(int)auVar32._0_4_) {
          uVar16 = (ulong)(int)auVar36._0_4_;
          psVar18 = &pBVar3[uVar16].super_RawBufferView.stride;
          do {
            pcVar4 = ((RawBufferView *)(psVar18 + -2))->ptr_ofs;
            sVar15 = *psVar18;
            lVar20 = sVar15 * (uVar12 + 1);
            lVar24 = sVar15 * (uVar12 + 2);
            lVar14 = sVar15 * (uVar12 + 3);
            auVar36 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + sVar15 * uVar12 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar4 + lVar20 + 0xc)),0x10);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(pcVar4 + lVar24 + 0xc)),0x20);
            auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(pcVar4 + lVar14 + 0xc)),0x30);
            auVar34._8_4_ = 0x7fffffff;
            auVar34._0_8_ = 0x7fffffff7fffffff;
            auVar34._12_4_ = 0x7fffffff;
            auVar36 = vandps_avx(auVar36,auVar34);
            auVar39._8_4_ = 0x5dccb9a2;
            auVar39._0_8_ = 0x5dccb9a25dccb9a2;
            auVar39._12_4_ = 0x5dccb9a2;
            auVar36 = vcmpps_avx(auVar36,auVar39,5);
            if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar36[0xf] < '\0') {
              auVar45 = ZEXT864(0);
              goto LAB_0121618f;
            }
            auVar49._8_4_ = 0xddccb9a2;
            auVar49._0_8_ = 0xddccb9a2ddccb9a2;
            auVar49._12_4_ = 0xddccb9a2;
            auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar15 * uVar12),auVar49,6);
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar15 * uVar12),auVar39,1);
            auVar36 = vandps_avx(auVar36,auVar27);
            uVar21 = vmovmskps_avx(auVar36);
            auVar43._0_12_ = ZEXT812(0);
            auVar45 = ZEXT1264(auVar43._0_12_);
            auVar43._12_4_ = 0;
            if ((~(byte)uVar21 & 7) != 0) goto LAB_0121618f;
            auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar20),auVar49,6);
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar20),auVar39,1);
            auVar36 = vandps_avx(auVar36,auVar27);
            uVar21 = vmovmskps_avx(auVar36);
            if ((~(byte)uVar21 & 7) != 0) goto LAB_0121618f;
            auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar49,6);
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar24),auVar39,1);
            auVar36 = vandps_avx(auVar36,auVar27);
            uVar21 = vmovmskps_avx(auVar36);
            if ((~(byte)uVar21 & 7) != 0) goto LAB_0121618f;
            auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar14),auVar49,6);
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar14),auVar39,1);
            auVar36 = vandps_avx(auVar36,auVar27);
            uVar21 = vmovmskps_avx(auVar36);
            if ((~(byte)uVar21 & 7) != 0) goto LAB_0121618f;
            uVar16 = uVar16 + 1;
            psVar18 = psVar18 + 7;
          } while (uVar16 <= (ulong)(long)(int)auVar32._0_4_);
        }
        local_118 = auVar66._0_16_;
        local_108 = auVar64._0_16_;
        local_f8 = auVar62._0_16_;
        local_e8 = auVar59._0_16_;
        local_d8 = auVar56._0_16_;
        local_c8 = auVar55._0_16_;
        local_b8 = auVar51._0_16_;
        fVar30 = (t0t1->lower - fVar25) / fVar26;
        fVar26 = (t0t1->upper - fVar25) / fVar26;
        fVar25 = fVar1 * fVar30;
        fVar37 = fVar1 * fVar26;
        auVar27 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),9);
        auVar34 = vroundss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),10);
        auVar36 = vmaxss_avx(auVar27,auVar43);
        auVar32 = vminss_avx(auVar34,ZEXT416((uint)fVar1));
        iVar19 = (int)auVar36._0_4_;
        fVar31 = auVar32._0_4_;
        local_168.primID = &local_170;
        uVar12 = (int)auVar27._0_4_;
        if ((int)auVar27._0_4_ < 0) {
          uVar12 = 0xffffffff;
        }
        iVar23 = (int)fVar1 + 1;
        if ((int)auVar34._0_4_ < (int)fVar1 + 1) {
          iVar23 = (int)auVar34._0_4_;
        }
        pCVar13 = this;
        local_170 = uVar22;
        local_168.this =
             (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
              *)this;
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_168,(long)iVar19);
        ::anon_func::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_168,(long)(int)fVar31);
        fVar25 = fVar25 - auVar36._0_4_;
        if (iVar23 - uVar12 == 1) {
          auVar36 = vmaxss_avx(ZEXT416((uint)fVar25),ZEXT816(0) << 0x40);
          auVar32 = vshufps_avx(auVar36,auVar36,0);
          auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar50._0_4_ = auVar32._0_4_ * local_158.m128[0] + auVar36._0_4_ * local_138.m128[0];
          auVar50._4_4_ = auVar32._4_4_ * local_158.m128[1] + auVar36._4_4_ * local_138.m128[1];
          auVar50._8_4_ = auVar32._8_4_ * local_158.m128[2] + auVar36._8_4_ * local_138.m128[2];
          auVar50._12_4_ = auVar32._12_4_ * local_158.m128[3] + auVar36._12_4_ * local_138.m128[3];
          auVar44._0_4_ = auVar32._0_4_ * local_148 + auVar36._0_4_ * local_128;
          auVar44._4_4_ = auVar32._4_4_ * fStack_144 + auVar36._4_4_ * fStack_124;
          auVar44._8_4_ = auVar32._8_4_ * fStack_140 + auVar36._8_4_ * fStack_120;
          auVar44._12_4_ = auVar32._12_4_ * fStack_13c + auVar36._12_4_ * fStack_11c;
          auVar36 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar37)),ZEXT816(0) << 0x40);
          auVar32 = vshufps_avx(auVar36,auVar36,0);
          auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar33._0_4_ = auVar36._0_4_ * local_158.m128[0] + auVar32._0_4_ * local_138.m128[0];
          auVar33._4_4_ = auVar36._4_4_ * local_158.m128[1] + auVar32._4_4_ * local_138.m128[1];
          auVar33._8_4_ = auVar36._8_4_ * local_158.m128[2] + auVar32._8_4_ * local_138.m128[2];
          auVar33._12_4_ = auVar36._12_4_ * local_158.m128[3] + auVar32._12_4_ * local_138.m128[3];
          auVar38._0_4_ = auVar36._0_4_ * local_148 + auVar32._0_4_ * local_128;
          auVar38._4_4_ = auVar36._4_4_ * fStack_144 + auVar32._4_4_ * fStack_124;
          auVar38._8_4_ = auVar36._8_4_ * fStack_140 + auVar32._8_4_ * fStack_120;
          auVar38._12_4_ = auVar36._12_4_ * fStack_13c + auVar32._12_4_ * fStack_11c;
        }
        else {
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_168,(long)(iVar19 + 1));
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_168,(long)((int)fVar31 + -1));
          auVar36 = vmaxss_avx(ZEXT416((uint)fVar25),ZEXT816(0) << 0x40);
          auVar32 = vshufps_avx(auVar36,auVar36,0);
          auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar50._0_4_ = auVar32._0_4_ * local_58.m128[0] + auVar36._0_4_ * local_138.m128[0];
          auVar50._4_4_ = auVar32._4_4_ * local_58.m128[1] + auVar36._4_4_ * local_138.m128[1];
          auVar50._8_4_ = auVar32._8_4_ * local_58.m128[2] + auVar36._8_4_ * local_138.m128[2];
          auVar50._12_4_ = auVar32._12_4_ * local_58.m128[3] + auVar36._12_4_ * local_138.m128[3];
          auVar44._0_4_ = auVar32._0_4_ * local_48 + auVar36._0_4_ * local_128;
          auVar44._4_4_ = auVar32._4_4_ * fStack_44 + auVar36._4_4_ * fStack_124;
          auVar44._8_4_ = auVar32._8_4_ * fStack_40 + auVar36._8_4_ * fStack_120;
          auVar44._12_4_ = auVar32._12_4_ * fStack_3c + auVar36._12_4_ * fStack_11c;
          auVar36 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar37)),ZEXT816(0) << 0x40);
          auVar32 = vshufps_avx(auVar36,auVar36,0);
          auVar36 = ZEXT416((uint)(1.0 - auVar36._0_4_));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar33._0_4_ = auVar32._0_4_ * local_78.m128[0] + auVar36._0_4_ * local_158.m128[0];
          auVar33._4_4_ = auVar32._4_4_ * local_78.m128[1] + auVar36._4_4_ * local_158.m128[1];
          auVar33._8_4_ = auVar32._8_4_ * local_78.m128[2] + auVar36._8_4_ * local_158.m128[2];
          auVar33._12_4_ = auVar32._12_4_ * local_78.m128[3] + auVar36._12_4_ * local_158.m128[3];
          auVar38._0_4_ = auVar32._0_4_ * local_68 + auVar36._0_4_ * local_148;
          auVar38._4_4_ = auVar32._4_4_ * fStack_64 + auVar36._4_4_ * fStack_144;
          auVar38._8_4_ = auVar32._8_4_ * fStack_60 + auVar36._8_4_ * fStack_140;
          auVar38._12_4_ = auVar32._12_4_ * fStack_5c + auVar36._12_4_ * fStack_13c;
          if ((int)(uVar12 + 1) < iVar23) {
            sVar15 = (size_t)(uVar12 + 1);
            iVar23 = ~uVar12 + iVar23;
            do {
              auVar28._0_4_ = ((float)(int)sVar15 / fVar1 - fVar30) / (fVar26 - fVar30);
              auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar36 = vshufps_avx(auVar28,auVar28,0);
              fVar25 = auVar33._4_4_;
              fVar37 = auVar33._8_4_;
              fVar31 = auVar33._12_4_;
              auVar32 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
              fVar52 = auVar50._4_4_;
              fVar53 = auVar50._8_4_;
              fVar54 = auVar50._12_4_;
              fVar40 = auVar38._4_4_;
              fVar41 = auVar38._8_4_;
              fVar42 = auVar38._12_4_;
              fVar46 = auVar44._4_4_;
              fVar47 = auVar44._8_4_;
              fVar48 = auVar44._12_4_;
              local_a8 = auVar38._0_4_ * auVar36._0_4_ + auVar44._0_4_ * auVar32._0_4_;
              fStack_a4 = fVar40 * auVar36._4_4_ + fVar46 * auVar32._4_4_;
              fStack_a0 = fVar41 * auVar36._8_4_ + fVar47 * auVar32._8_4_;
              fStack_9c = fVar42 * auVar36._12_4_ + fVar48 * auVar32._12_4_;
              ::anon_func::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_168,sVar15);
              auVar10._4_4_ = fVar25 * auVar36._4_4_ + fVar52 * auVar32._4_4_;
              auVar10._0_4_ = auVar33._0_4_ * auVar36._0_4_ + auVar50._0_4_ * auVar32._0_4_;
              auVar10._8_4_ = fVar37 * auVar36._8_4_ + fVar53 * auVar32._8_4_;
              auVar10._12_4_ = fVar31 * auVar36._12_4_ + fVar54 * auVar32._12_4_;
              auVar36 = vsubps_avx((undefined1  [16])local_98,auVar10);
              auVar11._4_4_ = fStack_a4;
              auVar11._0_4_ = local_a8;
              auVar11._8_4_ = fStack_a0;
              auVar11._12_4_ = fStack_9c;
              auVar27 = vsubps_avx(local_88,auVar11);
              auVar32 = vminps_avx(auVar36,ZEXT816(0) << 0x40);
              auVar36 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
              auVar50._0_4_ = auVar50._0_4_ + auVar32._0_4_;
              auVar50._4_4_ = fVar52 + auVar32._4_4_;
              auVar50._8_4_ = fVar53 + auVar32._8_4_;
              auVar50._12_4_ = fVar54 + auVar32._12_4_;
              auVar33._0_4_ = auVar33._0_4_ + auVar32._0_4_;
              auVar33._4_4_ = fVar25 + auVar32._4_4_;
              auVar33._8_4_ = fVar37 + auVar32._8_4_;
              auVar33._12_4_ = fVar31 + auVar32._12_4_;
              auVar44._0_4_ = auVar44._0_4_ + auVar36._0_4_;
              auVar44._4_4_ = fVar46 + auVar36._4_4_;
              auVar44._8_4_ = fVar47 + auVar36._8_4_;
              auVar44._12_4_ = fVar48 + auVar36._12_4_;
              auVar38._0_4_ = auVar38._0_4_ + auVar36._0_4_;
              auVar38._4_4_ = fVar40 + auVar36._4_4_;
              auVar38._8_4_ = fVar41 + auVar36._8_4_;
              auVar38._12_4_ = fVar42 + auVar36._12_4_;
              sVar15 = sVar15 + 1;
              iVar23 = iVar23 + -1;
            } while (iVar23 != 0);
          }
        }
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar50,ZEXT416(geomID),0x30);
        uVar12 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar16 = (ulong)uVar12;
        BVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar29._8_8_ = 0;
        auVar29._0_4_ = BVar2.lower;
        auVar29._4_4_ = BVar2.upper;
        aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar44,ZEXT416((uint)uVar22),0x30);
        aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar33,ZEXT416(uVar12),0x30);
        aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar38,ZEXT416(uVar12),0x30);
        auVar32 = vcmpps_avx(local_1b8,auVar29,1);
        auVar27 = vinsertps_avx(local_1b8,auVar29,0x50);
        auVar36 = vblendps_avx(auVar29,local_1b8,2);
        local_1b8 = vblendvps_avx(auVar36,auVar27,auVar32);
        auVar35._0_4_ = aVar6.x * 0.5 + aVar8.x * 0.5 + aVar7.x * 0.5 + aVar9.x * 0.5;
        auVar35._4_4_ = aVar6.y * 0.5 + aVar8.y * 0.5 + aVar7.y * 0.5 + aVar9.y * 0.5;
        auVar35._8_4_ = aVar6.z * 0.5 + aVar8.z * 0.5 + aVar7.z * 0.5 + aVar9.z * 0.5;
        auVar35._12_4_ =
             aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5 +
             aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5;
        auVar36 = vminps_avx(local_e8,auVar35);
        auVar59 = ZEXT1664(auVar36);
        auVar36 = vmaxps_avx(local_f8,auVar35);
        auVar62 = ZEXT1664(auVar36);
        local_1e0 = local_1e0 + 1;
        local_1d8 = local_1d8 + uVar16;
        auVar36 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)pCVar13 >> 8),local_208 < uVar16)
                                     ),0x50);
        auVar36 = vpslld_avx(auVar36,0x1f);
        auVar36 = vblendvps_avx(local_b8,auVar29,auVar36);
        auVar51 = ZEXT1664(auVar36);
        auVar36 = vminps_avx(local_d8,(undefined1  [16])aVar6);
        auVar56 = ZEXT1664(auVar36);
        if (local_208 <= uVar16) {
          local_208 = uVar16;
        }
        pPVar5 = prims->items;
        pPVar5[local_1d0].lbounds.bounds0.lower.field_0.field_1 = aVar6;
        auVar36 = vmaxps_avx(local_c8,(undefined1  [16])aVar7);
        auVar55 = ZEXT1664(auVar36);
        pPVar5[local_1d0].lbounds.bounds0.upper.field_0.field_1 = aVar7;
        auVar36 = vminps_avx(local_118,(undefined1  [16])aVar8);
        auVar66 = ZEXT1664(auVar36);
        pPVar5[local_1d0].lbounds.bounds1.lower.field_0.field_1 = aVar8;
        auVar36 = vmaxps_avx(local_108,(undefined1  [16])aVar9);
        auVar64 = ZEXT1664(auVar36);
        pPVar5[local_1d0].lbounds.bounds1.upper.field_0.field_1 = aVar9;
        pPVar5[local_1d0].time_range = BVar2;
        local_1d0 = local_1d0 + 1;
        uVar17 = r->_end;
        auVar45 = ZEXT464(0) << 0x20;
      }
LAB_0121618f:
      aVar60 = auVar55._0_16_;
      aVar57 = auVar56._0_16_;
      auVar36 = auVar51._0_16_;
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar17);
    (__return_storage_ptr__->object_range)._end = local_1e0;
    aVar65 = auVar66._0_16_;
    aVar63 = auVar64._0_16_;
    aVar58 = auVar59._0_16_;
    aVar61 = auVar62._0_16_;
  }
  else {
    local_1b8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar36 = ZEXT816(0x3f80000000000000);
    aVar57.m128[2] = INFINITY;
    aVar57._0_8_ = 0x7f8000007f800000;
    aVar57.m128[3] = INFINITY;
    aVar60.m128[2] = -INFINITY;
    aVar60._0_8_ = 0xff800000ff800000;
    aVar60.m128[3] = -INFINITY;
    local_208 = 0;
    local_1d8 = 0;
    aVar65 = aVar57;
    aVar63 = aVar60;
    aVar58 = aVar57;
    aVar61 = aVar60;
  }
  auVar36 = vmovlhps_avx(auVar36,local_1b8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar60;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar63;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar61;
  __return_storage_ptr__->num_time_segments = local_1d8;
  __return_storage_ptr__->max_num_time_segments = local_208;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar36._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar36._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar36._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar36._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }